

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall crnd::crn_unpacker::decode_color_selectors(crn_unpacker *this)

{
  vector<unsigned_int> *this_00;
  ushort uVar1;
  crn_header *pcVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  byte bVar6;
  uint32 uVar7;
  int iVar8;
  uint8 *puVar9;
  byte bVar10;
  uint uVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  static_huffman_data_model dm;
  static_huffman_data_model local_58;
  
  pcVar2 = this->m_pHeader;
  bVar10 = (pcVar2->m_format).m_buf[0];
  uVar11 = (uint)(pcVar2->m_color_selectors).m_size.m_buf[2] |
           (uint)(pcVar2->m_color_selectors).m_size.m_buf[1] << 8 |
           (uint)(pcVar2->m_color_selectors).m_size.m_buf[0] << 0x10;
  if (uVar11 != 0) {
    puVar9 = this->m_pData +
             ((ulong)(pcVar2->m_color_selectors).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar2->m_color_selectors).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar9;
    (this->m_codec).m_pDecode_buf_next = puVar9;
    (this->m_codec).m_decode_buf_size = uVar11;
    (this->m_codec).m_pDecode_buf_end = puVar9 + uVar11;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  local_58.m_total_syms = 0;
  local_58.m_code_sizes.m_p = (uchar *)0x0;
  local_58.m_code_sizes.m_size = 0;
  local_58.m_code_sizes.m_capacity = 0;
  local_58.m_code_sizes.m_alloc_failed = false;
  local_58.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&local_58);
  uVar21 = bVar10 - 10;
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  uVar14 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) << (uVar21 < 3);
  this_00 = &this->m_color_selectors;
  uVar11 = (this->m_color_selectors).m_size;
  if (uVar11 != uVar14) {
    if (uVar11 <= uVar14) {
      if (((this->m_color_selectors).m_capacity < uVar14) &&
         (bVar5 = elemental_vector::increase_capacity
                            ((elemental_vector *)this_00,uVar14,uVar11 + 1 == uVar14,4,
                             (object_mover)0x0), !bVar5)) {
        (this->m_color_selectors).m_alloc_failed = true;
        goto LAB_00113641;
      }
      uVar11 = (this->m_color_selectors).m_size;
      memset((this->m_color_selectors).m_p + uVar11,0,(ulong)(uVar14 - uVar11) << 2);
    }
    (this->m_color_selectors).m_size = uVar14;
  }
LAB_00113641:
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  if ((uVar1 & 0xff) != 0 || uVar1 >> 8 != 0) {
    uVar13 = 0;
    uVar11 = 0;
    do {
      uVar14 = 0xfffffffc;
      do {
        uVar14 = uVar14 + 4;
        uVar7 = symbol_codec::decode(&this->m_codec,&local_58);
        uVar11 = uVar11 ^ uVar7 << ((byte)uVar14 & 0x1f);
      } while (uVar14 < 0x1c);
      if (uVar21 < 5) {
        uVar15 = ~(uVar11 >> 1 & 0x55555555 ^ uVar11);
        uVar14 = (uint)uVar13 * 2 + 1;
        if (2 < uVar21) {
          uVar14 = (uint)uVar13;
        }
        puVar3 = this_00->m_p;
        bVar18 = 8;
        bVar10 = 0;
        bVar19 = 0;
        iVar8 = 0;
        do {
          puVar4 = this_00->m_p;
          iVar20 = 0;
          bVar17 = bVar18;
          bVar6 = bVar10;
          bVar12 = bVar19;
          do {
            if (uVar21 < 3) {
              uVar16 = uVar15 >> (bVar6 & 0x1f);
              puVar4[uVar13 * 2] =
                   puVar4[uVar13 * 2] | ((uVar16 & 1) << 0x10 | uVar16 >> 1 & 1) << (bVar17 & 0xf);
            }
            uVar16 = uVar15 >> (bVar12 & 0x1f);
            puVar3[uVar14] =
                 puVar3[uVar14] | ((uVar16 & 1) << 0x10 | uVar16 >> 1 & 1) << (bVar17 & 0xf);
            bVar17 = bVar17 + 4;
            iVar20 = iVar20 + -4;
            bVar12 = bVar12 + 2;
            bVar6 = bVar6 + 8;
          } while (iVar20 != -0x10);
          iVar8 = iVar8 + 1;
          bVar18 = bVar18 + 1;
          bVar19 = bVar19 + 8;
          bVar10 = bVar10 + 2;
        } while (iVar8 != 4);
      }
      else {
        this_00->m_p[uVar13] = uVar11 >> 1 & 0x55555555 | (uVar11 * 2 ^ uVar11) & 0xaaaaaaaa;
      }
      uVar13 = uVar13 + 1;
      uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
    } while (uVar13 < (ushort)(uVar1 << 8 | uVar1 >> 8));
  }
  static_huffman_data_model::~static_huffman_data_model(&local_58);
  return true;
}

Assistant:

bool decode_color_selectors()
        {
            const bool has_etc_color_blocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A || m_pHeader->m_format == cCRNFmtETC1S || m_pHeader->m_format == cCRNFmtETC2AS;
            const bool has_subblocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A;
            m_codec.start_decoding(m_pData + m_pHeader->m_color_selectors.m_ofs, m_pHeader->m_color_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_color_selectors.resize(m_pHeader->m_color_selectors.m_num << (has_subblocks ? 1 : 0));
            for (uint32 s = 0, i = 0; i < m_pHeader->m_color_selectors.m_num; i++)
            {
                for (uint32 j = 0; j < 32; j += 4)
                    s ^= m_codec.decode(dm) << j;
                if (has_etc_color_blocks)
                {
                    for (uint32 selector = (~s & 0xAAAAAAAA) | (~(s ^ s >> 1) & 0x55555555), t = 8, h = 0; h < 4; h++, t -= 15)
                    {
                        for (uint32 w = 0; w < 4; w++, t += 4)
                        {
                            if (has_subblocks)
                            {
                                uint32 s0 = selector >> (w << 3 | h << 1);
                                m_color_selectors[i << 1] |= ((s0 >> 1 & 1) | (s0 & 1) << 16) << (t & 15);
                            }
                            uint32 s1 = selector >> (h << 3 | w << 1);
                            m_color_selectors[has_subblocks ? i << 1 | 1 : i] |= ((s1 >> 1 & 1) | (s1 & 1) << 16) << (t & 15);
                        }
                    }
                }
                else
                {
                    m_color_selectors[i] = ((s ^ s << 1) & 0xAAAAAAAA) | (s >> 1 & 0x55555555);
                }
            }
            m_codec.stop_decoding();
            return true;
        }